

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool DownSizeUINT(ON__UINT64 u64,ON__UINT32 *u32)

{
  ulong uVar1;
  
  uVar1 = u64 >> 0x20;
  if (uVar1 != 0) {
    u64 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0xfc,"","u64 too big to convert to 4 byte unsigned int");
  }
  *u32 = (ON__UINT32)u64;
  return uVar1 == 0;
}

Assistant:

static
bool DownSizeUINT( ON__UINT64 u64, ON__UINT32* u32 )
{
  if ( u64 <= 0xFFFFFFFF )
  {
    *u32 = (ON__UINT32)u64;
    return true;
  }

  ON_ERROR("u64 too big to convert to 4 byte unsigned int");
  *u32 = 0;
  return false;
}